

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsOct<absl::lts_20250127::uint128>(IntDigits *this,uint128 v)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = v.lo_;
  lVar4 = 0;
  uVar5 = v.hi_;
  do {
    do {
      lVar3 = lVar4;
      bVar2 = (byte)uVar7;
      uVar7 = uVar7 >> 3 | uVar5 << 0x3d;
      this->storage_[lVar3 + 0x2b] = bVar2 & 7 | 0x30;
      uVar6 = uVar5 >> 3;
      lVar4 = lVar3 + -1;
      bVar1 = 7 < uVar5;
      uVar5 = uVar6;
    } while (bVar1);
  } while (uVar7 != 0);
  this->start_ = this->storage_ + lVar3 + 0x2b;
  this->size_ = -lVar4;
  return;
}

Assistant:

void PrintAsOct(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);
    do {
      *--p = static_cast<char>('0' + (static_cast<size_t>(v) & 7));
      v >>= 3;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }